

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayView.hpp
# Opt level: O1

void mserialize::detail::BuiltinSerializer<binlog::ArrayView<int>,_void>::
     serialize<binlog::detail::QueueWriter>(ArrayView<int> *s,QueueWriter *ostream)

{
  int *piVar1;
  int *elem;
  int *piVar2;
  
  *(int *)ostream->_writePos = (int)((ulong)((long)s->_end - (long)s->_begin) >> 2);
  ostream->_writePos = ostream->_writePos + 4;
  piVar1 = s->_end;
  for (piVar2 = s->_begin; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    *(int *)ostream->_writePos = *piVar2;
    ostream->_writePos = ostream->_writePos + 4;
  }
  return;
}

Assistant:

const T* end()   const { return _end;   }